

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O0

FaceHandle __thiscall OpenMesh::ArrayKernel::new_face(ArrayKernel *this)

{
  BaseHandle BVar1;
  vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_> *__x;
  reference pvVar2;
  vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_> *in_RDI;
  undefined1 local_14 [20];
  
  __x = in_RDI + 0xf8;
  memset(local_14,0,4);
  ArrayItems::Face::Face((Face *)0x1beea8);
  std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::push_back
            (in_RDI,(value_type *)__x);
  (**(code **)(*(long *)in_RDI + 0x28))();
  BaseKernel::fprops_resize((BaseKernel *)in_RDI,(size_t)__x);
  pvVar2 = std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
           back(in_RDI);
  BVar1.idx_ = handle((ArrayKernel *)in_RDI,pvVar2);
  return (BaseHandle)(BaseHandle)BVar1.idx_;
}

Assistant:

inline FaceHandle new_face()
  {
    faces_.push_back(Face());
    fprops_resize(n_faces());
    return handle(faces_.back());
  }